

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-loop-alive.c
# Opt level: O1

int run_test_loop_alive(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  long lVar2;
  undefined8 uVar3;
  undefined8 extraout_RAX;
  uv_timer_t *unaff_RBX;
  uv_timer_t *puVar4;
  int in_ESI;
  uv_timer_t *puVar5;
  undefined8 in_R8;
  undefined8 in_R9;
  uv_timer_t auStack_380 [5];
  uv_timer_t *puStack_30;
  
  lVar2 = uv_default_loop();
  iVar1 = uv_loop_alive();
  if (iVar1 == 0) {
    uVar3 = uv_default_loop();
    unaff_RBX = &timer_handle;
    uv_timer_init(uVar3,&timer_handle);
    in_ESI = 0x1638d3;
    uv_timer_start(&timer_handle,timer_cb,100,0);
    lVar2 = uv_default_loop();
    iVar1 = uv_loop_alive();
    if (iVar1 == 0) goto LAB_001638b0;
    lVar2 = uv_default_loop();
    in_ESI = 0;
    iVar1 = uv_run();
    if (iVar1 != 0) goto LAB_001638b5;
    lVar2 = uv_default_loop();
    iVar1 = uv_loop_alive();
    if (iVar1 != 0) goto LAB_001638ba;
    lVar2 = uv_default_loop();
    in_ESI = 0x30dc00;
    iVar1 = uv_queue_work(lVar2,&work_req,work_cb,after_work_cb);
    if (iVar1 != 0) goto LAB_001638bf;
    lVar2 = uv_default_loop();
    iVar1 = uv_loop_alive();
    if (iVar1 == 0) goto LAB_001638c4;
    lVar2 = uv_default_loop();
    in_ESI = 0;
    iVar1 = uv_run();
    if (iVar1 != 0) goto LAB_001638c9;
    lVar2 = uv_default_loop();
    iVar1 = uv_loop_alive();
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_loop_alive_cold_1();
LAB_001638b0:
    run_test_loop_alive_cold_8();
LAB_001638b5:
    run_test_loop_alive_cold_2();
LAB_001638ba:
    run_test_loop_alive_cold_3();
LAB_001638bf:
    run_test_loop_alive_cold_4();
LAB_001638c4:
    run_test_loop_alive_cold_7();
LAB_001638c9:
    run_test_loop_alive_cold_5();
  }
  run_test_loop_alive_cold_6();
  if (lVar2 != 0) {
    return extraout_EAX;
  }
  timer_cb_cold_1();
  if (lVar2 != 0) {
    return extraout_EAX_00;
  }
  work_cb_cold_1();
  if (lVar2 == 0) {
    after_work_cb_cold_2();
  }
  else if (in_ESI == 0) {
    return extraout_EAX_01;
  }
  after_work_cb_cold_1();
  puVar4 = auStack_380;
  puVar5 = puVar4;
  auStack_380[0].data = puVar4;
  puStack_30 = unaff_RBX;
  iVar1 = uv_loop_init();
  if (iVar1 == 0) {
    if ((uv_timer_t *)auStack_380[0].data != puVar4) goto LAB_001639ca;
    puVar4 = &timer_handle;
    puVar5 = auStack_380;
    uv_timer_init(puVar5,&timer_handle);
    uv_timer_start(&timer_handle,timer_cb,100,100);
    iVar1 = uv_loop_close();
    if (iVar1 != -0x10) goto LAB_001639cf;
    puVar4 = auStack_380;
    uv_run(puVar4,0);
    uv_close(&timer_handle,0);
    puVar5 = puVar4;
    iVar1 = uv_run(puVar4,0);
    if (iVar1 != 0) goto LAB_001639d4;
    if ((uv_timer_t *)auStack_380[0].data != puVar4) goto LAB_001639d9;
    puVar4 = auStack_380;
    puVar5 = puVar4;
    iVar1 = uv_loop_close();
    if (iVar1 != 0) goto LAB_001639de;
    if ((uv_timer_t *)auStack_380[0].data == puVar4) {
      return 0;
    }
  }
  else {
    run_test_loop_close_cold_1();
LAB_001639ca:
    run_test_loop_close_cold_2();
LAB_001639cf:
    run_test_loop_close_cold_3();
LAB_001639d4:
    run_test_loop_close_cold_4();
LAB_001639d9:
    run_test_loop_close_cold_5();
LAB_001639de:
    run_test_loop_close_cold_6();
  }
  run_test_loop_close_cold_7();
  if (puVar5 != (uv_timer_t *)0x0) {
    iVar1 = uv_stop(puVar5->loop);
    return iVar1;
  }
  uVar3 = extraout_RAX;
  timer_cb_cold_1();
  iVar1 = uv_loop_init(&run_test_loop_instant_close::loop);
  if (iVar1 == 0) {
    iVar1 = uv_queue_work(&run_test_loop_instant_close::loop,&run_test_loop_instant_close::req,
                          loop_instant_close_work_cb,loop_instant_close_after_work_cb,in_R8,in_R9,
                          puVar4,uVar3);
    if (iVar1 == 0) {
      uVar3 = uv_default_loop();
      uv_walk(uVar3,close_walk_cb,0);
      uv_run(uVar3,0);
      uVar3 = uv_default_loop();
      iVar1 = uv_loop_close(uVar3);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00163a74;
    }
  }
  else {
    run_test_loop_instant_close_cold_1();
  }
  run_test_loop_instant_close_cold_2();
LAB_00163a74:
  run_test_loop_instant_close_cold_3();
  return extraout_EAX_02;
}

Assistant:

TEST_IMPL(loop_alive) {
  int r;
  ASSERT(!uv_loop_alive(uv_default_loop()));

  /* loops with handles are alive */
  uv_timer_init(uv_default_loop(), &timer_handle);
  uv_timer_start(&timer_handle, timer_cb, 100, 0);
  ASSERT(uv_loop_alive(uv_default_loop()));

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);
  ASSERT(!uv_loop_alive(uv_default_loop()));

  /* loops with requests are alive */
  r = uv_queue_work(uv_default_loop(), &work_req, work_cb, after_work_cb);
  ASSERT(r == 0);
  ASSERT(uv_loop_alive(uv_default_loop()));

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);
  ASSERT(!uv_loop_alive(uv_default_loop()));

  return 0;
}